

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::evaluateCollocationConstraintSecondDerivatives
          (ForwardEuler *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,VectorDynSize *lambda,CollocationHessianMap *stateSecondDerivative,
          CollocationHessianMap *controlSecondDerivative,
          CollocationHessianMap *stateControlSecondDerivative)

{
  double *pdVar1;
  double *pdVar2;
  element_type *peVar3;
  double dVar4;
  CollocationHessianMap *this_00;
  VectorDynSize *pVVar5;
  int iVar6;
  Index size;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  mapped_type *pmVar10;
  ostream *poVar11;
  string *psVar12;
  ulong uVar13;
  char *pcVar14;
  MatrixDynSize *pMVar15;
  long lVar16;
  ulong uVar17;
  pointer pcVar18;
  ostringstream errorMsg;
  long *local_1e8;
  long local_1d8 [2];
  CollocationHessianMap *local_1c8;
  VectorDynSize *local_1c0;
  double local_1b8;
  CollocationHessianIndex local_1a8 [7];
  ios_base local_138 [264];
  
  peVar3 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
           super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    psVar12 = IntegratorInfo::name_abi_cxx11_
                        (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
    pcVar18 = (psVar12->_M_dataplus)._M_p;
    pcVar14 = "Dynamical system not set.";
LAB_0017e986:
    iDynTree::reportError(pcVar18,"evaluateCollocationConstraintSecondDerivatives",pcVar14);
  }
  else {
    if ((long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      if ((long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_start == 0x40) {
        local_1b8 = dT;
        iVar6 = (*peVar3->_vptr_DynamicalSystem[3])();
        if ((char)iVar6 == '\0') {
          psVar12 = IntegratorInfo::name_abi_cxx11_
                              (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar18 = (psVar12->_M_dataplus)._M_p;
          pcVar14 = "Error while setting the control input.";
        }
        else {
          local_1c8 = controlSecondDerivative;
          lVar7 = iDynTree::VectorDynSize::data();
          iDynTree::VectorDynSize::size();
          uVar8 = iDynTree::VectorDynSize::data();
          local_1c0 = &this->m_lambda;
          uVar9 = iDynTree::VectorDynSize::size();
          pVVar5 = local_1c0;
          uVar13 = uVar9;
          if (((uVar8 & 7) == 0) &&
             (uVar13 = (ulong)((uint)(uVar8 >> 3) & 1), (long)uVar9 <= (long)uVar13)) {
            uVar13 = uVar9;
          }
          lVar16 = uVar9 - uVar13;
          if (0 < (long)uVar13) {
            uVar17 = 0;
            do {
              *(double *)(uVar8 + uVar17 * 8) = *(double *)(lVar7 + uVar17 * 8) * local_1b8;
              uVar17 = uVar17 + 1;
            } while (uVar13 != uVar17);
          }
          uVar17 = (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + uVar13;
          if (1 < lVar16) {
            do {
              pdVar2 = (double *)(lVar7 + uVar13 * 8);
              dVar4 = pdVar2[1];
              pdVar1 = (double *)(uVar8 + uVar13 * 8);
              *pdVar1 = *pdVar2 * local_1b8;
              pdVar1[1] = dVar4 * local_1b8;
              uVar13 = uVar13 + 2;
            } while ((long)uVar13 < (long)uVar17);
          }
          if ((long)uVar17 < (long)uVar9) {
            do {
              *(double *)(uVar8 + uVar17 * 8) = *(double *)(lVar7 + uVar17 * 8) * local_1b8;
              uVar17 = uVar17 + 1;
            } while (uVar9 != uVar17);
          }
          peVar3 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          iVar6 = (*peVar3->_vptr_DynamicalSystem[0xd])
                            (time,peVar3,
                             (collocationPoints->
                             super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                             )._M_impl.super__Vector_impl_data._M_start,local_1c0,
                             &this->m_stateHessianBuffer);
          if ((char)iVar6 == '\0') {
            psVar12 = IntegratorInfo::name_abi_cxx11_
                                (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
            pcVar18 = (psVar12->_M_dataplus)._M_p;
            pcVar14 = "Error while evaluating the dynamical system state second derivative.";
          }
          else {
            CollocationHessianIndex::CollocationHessianIndex(local_1a8,0,0);
            pmVar10 = std::
                      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                      ::operator[](stateSecondDerivative,local_1a8);
            iDynTree::MatrixDynSize::operator=(pmVar10,&this->m_stateHessianBuffer);
            CollocationHessianIndex::CollocationHessianIndex(local_1a8,0,1);
            pmVar10 = std::
                      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                      ::operator[](stateSecondDerivative,local_1a8);
            iDynTree::MatrixDynSize::operator=(pmVar10,&this->m_zeroNxNxBuffer);
            CollocationHessianIndex::CollocationHessianIndex(local_1a8,1,1);
            pmVar10 = std::
                      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                      ::operator[](stateSecondDerivative,local_1a8);
            iDynTree::MatrixDynSize::operator=(pmVar10,&this->m_zeroNxNxBuffer);
            peVar3 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            iVar6 = (*peVar3->_vptr_DynamicalSystem[0xe])
                              (time,peVar3,
                               (collocationPoints->
                               super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                               )._M_impl.super__Vector_impl_data._M_start,pVVar5,
                               &this->m_controlHessianBuffer);
            if ((char)iVar6 == '\0') {
              psVar12 = IntegratorInfo::name_abi_cxx11_
                                  (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
              pcVar18 = (psVar12->_M_dataplus)._M_p;
              pcVar14 = "Error while evaluating the dynamical system control second derivative.";
            }
            else {
              CollocationHessianIndex::CollocationHessianIndex(local_1a8,0,0);
              this_00 = local_1c8;
              pmVar10 = std::
                        map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                        ::operator[](local_1c8,local_1a8);
              iDynTree::MatrixDynSize::operator=(pmVar10,&this->m_controlHessianBuffer);
              CollocationHessianIndex::CollocationHessianIndex(local_1a8,0,1);
              pmVar10 = std::
                        map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                        ::operator[](this_00,local_1a8);
              iDynTree::MatrixDynSize::operator=(pmVar10,&this->m_zeroNuNuBuffer);
              CollocationHessianIndex::CollocationHessianIndex(local_1a8,1,1);
              pmVar10 = std::
                        map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                        ::operator[](this_00,local_1a8);
              iDynTree::MatrixDynSize::operator=(pmVar10,&this->m_zeroNuNuBuffer);
              peVar3 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              iVar6 = (*peVar3->_vptr_DynamicalSystem[0xf])
                                (time,peVar3,
                                 (collocationPoints->
                                 super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                 )._M_impl.super__Vector_impl_data._M_start,pVVar5,
                                 &this->m_mixedHessianBuffer);
              if ((char)iVar6 != '\0') {
                CollocationHessianIndex::CollocationHessianIndex(local_1a8,0,0);
                pmVar10 = std::
                          map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                          ::operator[](stateControlSecondDerivative,local_1a8);
                iDynTree::MatrixDynSize::operator=(pmVar10,&this->m_mixedHessianBuffer);
                pMVar15 = &this->m_zeroNxNuBuffer;
                CollocationHessianIndex::CollocationHessianIndex(local_1a8,0,1);
                pmVar10 = std::
                          map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                          ::operator[](stateControlSecondDerivative,local_1a8);
                iDynTree::MatrixDynSize::operator=(pmVar10,pMVar15);
                CollocationHessianIndex::CollocationHessianIndex(local_1a8,1,0);
                pmVar10 = std::
                          map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                          ::operator[](stateControlSecondDerivative,local_1a8);
                iDynTree::MatrixDynSize::operator=(pmVar10,pMVar15);
                CollocationHessianIndex::CollocationHessianIndex(local_1a8,1,1);
                pmVar10 = std::
                          map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                          ::operator[](stateControlSecondDerivative,local_1a8);
                iDynTree::MatrixDynSize::operator=(pmVar10,pMVar15);
                return true;
              }
              psVar12 = IntegratorInfo::name_abi_cxx11_
                                  (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
              pcVar18 = (psVar12->_M_dataplus)._M_p;
              pcVar14 = 
              "Error while evaluating the dynamical system second derivative wrt state and control."
              ;
            }
          }
        }
        goto LAB_0017e986;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "The size of the matrix containing the control inputs does not match the expected one. Input = "
                 ,0x5e);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,", Expected = 2.",0xf);
      psVar12 = IntegratorInfo::name_abi_cxx11_
                          (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar14 = (psVar12->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar14,"evaluateCollocationConstraintSecondDerivatives",(char *)local_1e8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "The size of the matrix containing the collocation point does not match the expected one. Input = "
                 ,0x61);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,", Expected = 2.",0xf);
      psVar12 = IntegratorInfo::name_abi_cxx11_
                          (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar14 = (psVar12->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar14,"evaluateCollocationConstraintSecondDerivatives",(char *)local_1e8);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return false;
}

Assistant:

bool ForwardEuler::evaluateCollocationConstraintSecondDerivatives(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                                              const std::vector<VectorDynSize> &controlInputs, double dT,
                                                                              const VectorDynSize &lambda, CollocationHessianMap &stateSecondDerivative,
                                                                              CollocationHessianMap &controlSecondDerivative, CollocationHessianMap &stateControlSecondDerivative)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", errorMsg.str().c_str());
                    return false;
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", "Error while setting the control input.");
                    return false;
                }

                toEigen(m_lambda) = dT * toEigen(lambda);

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTState(time, collocationPoints[0], m_lambda, m_stateHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system state second derivative.");
                    return false;
                }

                stateSecondDerivative[CollocationHessianIndex(0, 0)] = m_stateHessianBuffer;

                stateSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNxNxBuffer;

                stateSecondDerivative[CollocationHessianIndex(1, 1)] = m_zeroNxNxBuffer;

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTControl(time, collocationPoints[0], m_lambda, m_controlHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system control second derivative.");
                    return false;
                }

                controlSecondDerivative[CollocationHessianIndex(0, 0)] = m_controlHessianBuffer;

                controlSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNuNuBuffer;

                controlSecondDerivative[CollocationHessianIndex(1, 1)] = m_zeroNuNuBuffer;


                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTStateControl(time, collocationPoints[0], m_lambda, m_mixedHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system second derivative wrt state and control.");
                    return false;
                }

                stateControlSecondDerivative[CollocationHessianIndex(0, 0)] = m_mixedHessianBuffer;

                stateControlSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNxNuBuffer;

                stateControlSecondDerivative[CollocationHessianIndex(1, 0)] = m_zeroNxNuBuffer;

                stateControlSecondDerivative[CollocationHessianIndex(1, 1)] = m_zeroNxNuBuffer;


                return true;
            }